

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void uprops_addPropertyStarts_63(UPropertySource src,USetAdder *sa,UErrorCode *pErrorCode)

{
  UCPTrie *trie;
  int iVar1;
  int start;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (src - UPROPS_SRC_INPC < 3) {
    trie = (UCPTrie *)(&PTR_inpc_trie_004887d0)[src - UPROPS_SRC_INPC];
    start = 0;
    iVar1 = ucptrie_getRange_63(trie,0,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,(void *)0x0,
                                (uint32_t *)0x0);
    while (-1 < iVar1) {
      (*(code *)sa->add)(sa->set,start);
      start = iVar1 + 1;
      iVar1 = ucptrie_getRange_63(trie,start,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                  (void *)0x0,(uint32_t *)0x0);
    }
    return;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }